

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O2

UInt32 * crnlib::Hc_GetMatchesSpec
                   (UInt32 lenLimit,UInt32 curMatch,UInt32 pos,Byte *cur,CLzRef *son,
                   UInt32 _cyclicBufferPos,UInt32 _cyclicBufferSize,UInt32 cutValue,
                   UInt32 *distances,UInt32 maxLen)

{
  UInt32 *pUVar1;
  ulong uVar2;
  uint uVar3;
  Byte *pBVar4;
  UInt32 UVar5;
  UInt32 UVar6;
  ulong uVar7;
  bool bVar8;
  
  son[_cyclicBufferPos] = curMatch;
  do {
    do {
      do {
        bVar8 = cutValue == 0;
        cutValue = cutValue - 1;
        if (bVar8) {
          return distances;
        }
        uVar3 = pos - curMatch;
        if (_cyclicBufferSize <= uVar3) {
          return distances;
        }
        pBVar4 = cur + -(ulong)uVar3;
        UVar5 = 0;
        if (_cyclicBufferPos < uVar3) {
          UVar5 = _cyclicBufferSize;
        }
        curMatch = son[(_cyclicBufferPos - uVar3) + UVar5];
      } while ((pBVar4[maxLen] != cur[maxLen]) || (*pBVar4 != *cur));
      UVar5 = 0;
      uVar7 = 1;
      do {
        if (uVar7 - (lenLimit - 1) == 1) {
          UVar5 = lenLimit;
          UVar6 = (UInt32)uVar7;
          break;
        }
        uVar2 = uVar7 & 0xffffffff;
        uVar7 = uVar7 + 1;
        UVar5 = UVar5 + 1;
        UVar6 = UVar5;
      } while (pBVar4[uVar2] == cur[uVar2]);
    } while (UVar5 <= maxLen);
    pUVar1 = distances + 2;
    *distances = UVar5;
    distances[1] = uVar3 - 1;
    distances = pUVar1;
    maxLen = UVar5;
    if (UVar6 == lenLimit) {
      return pUVar1;
    }
  } while( true );
}

Assistant:

static UInt32* Hc_GetMatchesSpec(UInt32 lenLimit, UInt32 curMatch, UInt32 pos, const Byte* cur, CLzRef* son,
                                 UInt32 _cyclicBufferPos, UInt32 _cyclicBufferSize, UInt32 cutValue,
                                 UInt32* distances, UInt32 maxLen) {
  son[_cyclicBufferPos] = curMatch;
  for (;;) {
    UInt32 delta = pos - curMatch;
    if (cutValue-- == 0 || delta >= _cyclicBufferSize)
      return distances;
    {
      const Byte* pb = cur - delta;
      curMatch = son[_cyclicBufferPos - delta + ((delta > _cyclicBufferPos) ? _cyclicBufferSize : 0)];
      if (pb[maxLen] == cur[maxLen] && *pb == *cur) {
        UInt32 len = 0;
        while (++len != lenLimit)
          if (pb[len] != cur[len])
            break;
        if (maxLen < len) {
          *distances++ = maxLen = len;
          *distances++ = delta - 1;
          if (len == lenLimit)
            return distances;
        }
      }
    }
  }
}